

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_generators.cpp
# Opt level: O3

string * __thiscall
flatbuffers::SimpleFloatConstantGenerator::Inf_abi_cxx11_
          (string *__return_storage_ptr__,SimpleFloatConstantGenerator *this,double v)

{
  pointer pcVar1;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar1 = (&this->pos_inf_number_)[v < 0.0]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,pcVar1,
             pcVar1 + (&this->pos_inf_number_)[v < 0.0]._M_string_length);
  return __return_storage_ptr__;
}

Assistant:

std::string SimpleFloatConstantGenerator::Inf(double v) const {
  return (v < 0) ? neg_inf_number_ : pos_inf_number_;
}